

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O2

bool __thiscall lr_grammar::GrammarLR::sim(GrammarLR *this,char *testString)

{
  pointer pvVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  int *piVar7;
  _Elt_pointer psVar8;
  int i;
  ulong uVar9;
  int i_1;
  stackElem e;
  string text;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ipString;
  vector<stackElem,_std::allocator<stackElem>_> elemprint;
  string tmp;
  stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_> s;
  string bufS;
  char buffer [200];
  stringstream sstream;
  stackElem local_508;
  long local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  long local_4b8;
  int local_4ac;
  _Vector_base<stackElem,_std::allocator<stackElem>_> local_4a8;
  long local_490;
  ulong local_488;
  long local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  _Deque_base<stackElem,_std::allocator<stackElem>_> local_438;
  string local_3e8;
  string local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  undefined1 *local_2a8;
  undefined8 local_2a0;
  undefined1 local_298 [16];
  char local_288 [208];
  long local_1b8 [2];
  ostream local_1a8 [376];
  
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_368,testString,(allocator *)local_1b8);
  public_tool::parse_elem(&local_368,&local_4d8);
  std::__cxx11::string::~string((string *)&local_368);
  std::stack<stackElem,std::deque<stackElem,std::allocator<stackElem>>>::
  stack<std::deque<stackElem,std::allocator<stackElem>>,void>
            ((stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_> *)&local_438);
  local_4a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8 = local_298;
  local_2a0 = 0;
  local_298[0] = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  local_458._M_string_length = 0;
  local_458.field_2._M_local_buf[0] = '\0';
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  local_4f8._M_string_length = 0;
  local_4f8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_388,"#",(allocator *)&local_478);
  local_508.elemKey = find_name(this,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  local_508 = (stackElem)((ulong)(uint)local_508.elemKey << 0x20);
  std::deque<stackElem,_std::allocator<stackElem>_>::push_back
            ((deque<stackElem,_std::allocator<stackElem>_> *)&local_438,&local_508);
  std::vector<stackElem,_std::allocator<stackElem>_>::push_back
            ((vector<stackElem,_std::allocator<stackElem>_> *)&local_4a8,&local_508);
  local_490 = 0;
  uVar5 = 0;
  do {
    local_488 = (ulong)uVar5;
    local_500 = local_488 << 5;
    do {
      while( true ) {
        lVar6 = (long)local_508.states;
        pvVar1 = (this->action_table).
                 super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string
                  ((string *)&local_3e8,
                   (string *)
                   ((long)&((local_4d8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                   local_500));
        iVar3 = find_name(this,&local_3e8);
        if (*(int *)(*(long *)&pvVar1[lVar6].
                               super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                               ._M_impl.super__Vector_impl_data + (long)iVar3 * 0xc) == 1) {
          std::__cxx11::string::~string((string *)&local_3e8);
        }
        else {
          lVar6 = (long)local_508.states;
          pvVar1 = (this->action_table).
                   super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::string
                    ((string *)&local_2c8,
                     (string *)
                     ((long)&((local_4d8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     local_500));
          iVar3 = find_name(this,&local_2c8);
          iVar3 = *(int *)(*(long *)&pvVar1[lVar6].
                                     super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                                     ._M_impl.super__Vector_impl_data + (long)iVar3 * 0xc);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_3e8);
          if (iVar3 != 0) {
            lVar6 = (long)local_508.states;
            pvVar1 = (this->action_table).
                     super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::string
                      ((string *)&local_3c8,
                       (string *)
                       ((long)&((local_4d8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       local_500));
            iVar3 = find_name(this,&local_3c8);
            iVar3 = *(int *)(*(long *)&pvVar1[lVar6].
                                       super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                                       ._M_impl.super__Vector_impl_data + (long)iVar3 * 0xc);
            std::__cxx11::string::~string((string *)&local_3c8);
            if (iVar3 == 2) {
              std::operator+(&local_478,&local_4f8,"ERROR\n");
            }
            else {
              std::operator+(&local_478,&local_4f8,"ACC\n");
            }
            std::__cxx11::string::operator=((string *)&local_4f8,(string *)&local_478);
            std::__cxx11::string::~string((string *)&local_478);
            std::operator<<((ostream *)&std::cout,(string *)&local_4f8);
            std::__cxx11::string::~string((string *)&local_4f8);
            std::__cxx11::string::~string((string *)&local_458);
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::__cxx11::string::~string((string *)&local_2a8);
            std::_Vector_base<stackElem,_std::allocator<stackElem>_>::~_Vector_base(&local_4a8);
            std::_Deque_base<stackElem,_std::allocator<stackElem>_>::~_Deque_base(&local_438);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_4d8);
            return iVar3 != 2;
          }
        }
        psVar8 = local_438._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_438._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_438._M_impl.super__Deque_impl_data._M_finish._M_first) {
          psVar8 = local_438._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        local_508 = psVar8[-1];
        std::__cxx11::string::assign((char *)&local_458);
        uVar9 = 0;
        while( true ) {
          iVar3 = (int)(basic_istream<char,_std::char_traits<char>_> *)local_1b8;
          if ((ulong)((long)local_4a8._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_4a8._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar9)
          break;
          std::operator+(&local_478,&local_458,
                         &(this->elements).
                          super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                          ._M_impl.super__Vector_impl_data._M_start
                          [local_4a8._M_impl.super__Vector_impl_data._M_start[uVar9].elemKey].
                          super_Elem.name);
          std::__cxx11::string::operator=((string *)&local_458,(string *)&local_478);
          std::__cxx11::string::~string((string *)&local_478);
          std::ios::clear((int)*(undefined8 *)(local_1b8[0] + -0x18) + iVar3);
          std::ostream::operator<<
                    (local_1a8,local_4a8._M_impl.super__Vector_impl_data._M_start[uVar9].states);
          std::operator>>((basic_istream<char,_std::char_traits<char>_> *)local_1b8,local_288);
          std::operator+(&local_478,&local_458,local_288);
          std::__cxx11::string::operator=((string *)&local_458,(string *)&local_478);
          std::__cxx11::string::~string((string *)&local_478);
          uVar9 = uVar9 + 1;
        }
        sprintf(local_288,"%-25s",local_458._M_dataplus._M_p);
        std::operator+(&local_478,&local_4f8,local_288);
        std::__cxx11::string::operator=((string *)&local_4f8,(string *)&local_478);
        std::__cxx11::string::~string((string *)&local_478);
        std::__cxx11::string::assign((char *)&local_458);
        lVar6 = local_490;
        for (uVar9 = local_488;
            uVar9 < (ulong)((long)local_4d8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_4d8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5); uVar9 = uVar9 + 1
            ) {
          std::operator+(&local_478,&local_458,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((local_4d8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar6));
          std::__cxx11::string::operator=((string *)&local_458,(string *)&local_478);
          std::__cxx11::string::~string((string *)&local_478);
          lVar6 = lVar6 + 0x20;
        }
        sprintf(local_288,"%+15s         ",local_458._M_dataplus._M_p);
        std::operator+(&local_478,&local_4f8,local_288);
        std::__cxx11::string::operator=((string *)&local_4f8,(string *)&local_478);
        std::__cxx11::string::~string((string *)&local_478);
        lVar6 = (long)local_508.states;
        pvVar1 = (this->action_table).
                 super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string
                  ((string *)&local_2e8,
                   (string *)
                   ((long)&((local_4d8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                   local_500));
        iVar4 = find_name(this,&local_2e8);
        iVar4 = *(int *)(*(long *)&pvVar1[lVar6].
                                   super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                                   ._M_impl.super__Vector_impl_data + (long)iVar4 * 0xc);
        std::__cxx11::string::~string((string *)&local_2e8);
        if (iVar4 != 1) break;
        std::operator+(&local_478,&local_4f8,"REDUCE:");
        std::__cxx11::string::operator=((string *)&local_4f8,(string *)&local_478);
        std::__cxx11::string::~string((string *)&local_478);
        lVar6 = (long)local_508.states;
        pvVar1 = (this->action_table).
                 super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string
                  ((string *)&local_308,
                   (string *)
                   ((long)&((local_4d8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                   local_500));
        iVar4 = find_name(this,&local_308);
        lVar6 = *(long *)&pvVar1[lVar6].
                          super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                          ._M_impl.super__Vector_impl_data;
        iVar3 = *(int *)(lVar6 + 4 + (long)iVar4 * 0xc);
        iVar4 = *(int *)(lVar6 + 8 + (long)iVar4 * 0xc);
        std::__cxx11::string::~string((string *)&local_308);
        lVar6 = (long)iVar3;
        local_4b8 = lVar6 * 0x48;
        local_4ac = iVar3;
        std::operator+(&local_3a8,&local_4f8,
                       &(this->elements).
                        super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar6].super_Elem.name);
        local_480 = lVar6;
        std::operator+(&local_478,&local_3a8,"->");
        std::__cxx11::string::operator=((string *)&local_4f8,(string *)&local_478);
        std::__cxx11::string::~string((string *)&local_478);
        std::__cxx11::string::~string((string *)&local_3a8);
        lVar6 = (long)iVar4 * 0x18;
        for (uVar9 = 0;
            lVar2 = *(long *)((long)&(((this->elements).
                                       super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->expression_of_set
                                     ).
                                     super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                     ._M_impl + local_4b8),
            uVar9 < (ulong)(*(long *)(lVar2 + 8 + lVar6) - *(long *)(lVar2 + lVar6) >> 2);
            uVar9 = uVar9 + 1) {
          piVar7 = base_grammar::Express::operator[]((Express *)(lVar2 + lVar6),(int)uVar9);
          if (*piVar7 != -1) {
            piVar7 = base_grammar::Express::operator[]
                               ((Express *)
                                (*(long *)((long)&(((this->elements).
                                                                                                        
                                                  super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  expression_of_set).
                                                  super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                                  ._M_impl + local_4b8) + lVar6),(int)uVar9);
            std::operator+(&local_478,&local_4f8,
                           &(this->elements).
                            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                            ._M_impl.super__Vector_impl_data._M_start[*piVar7].super_Elem.name);
            std::__cxx11::string::operator=((string *)&local_4f8,(string *)&local_478);
            std::__cxx11::string::~string((string *)&local_478);
          }
        }
        std::operator+(&local_478,&local_4f8,"\n");
        std::__cxx11::string::operator=((string *)&local_4f8,(string *)&local_478);
        std::__cxx11::string::~string((string *)&local_478);
        for (uVar9 = 0;
            lVar2 = *(long *)((long)&(((this->elements).
                                       super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->expression_of_set
                                     ).
                                     super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                     ._M_impl + local_4b8),
            uVar9 < (ulong)(*(long *)(lVar2 + 8 + lVar6) - *(long *)(lVar2 + lVar6) >> 2);
            uVar9 = uVar9 + 1) {
          std::deque<stackElem,_std::allocator<stackElem>_>::pop_back
                    ((deque<stackElem,_std::allocator<stackElem>_> *)&local_438);
          local_4a8._M_impl.super__Vector_impl_data._M_finish =
               local_4a8._M_impl.super__Vector_impl_data._M_finish + -1;
        }
        psVar8 = local_438._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_438._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_438._M_impl.super__Deque_impl_data._M_finish._M_first) {
          psVar8 = local_438._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        local_508 = psVar8[-1];
        lVar6 = *(long *)&(this->action_table).
                          super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_508.states].
                          super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                          ._M_impl.super__Vector_impl_data;
        if (*(int *)(lVar6 + local_480 * 0xc) == 2) {
          std::operator+(&local_478,&local_4f8,"ERROR");
          std::__cxx11::string::operator=((string *)&local_4f8,(string *)&local_478);
          std::__cxx11::string::~string((string *)&local_478);
        }
        else {
          local_508.elemKey = local_4ac;
          local_508.states = *(int *)(lVar6 + local_480 * 0xc + 4);
          std::deque<stackElem,_std::allocator<stackElem>_>::push_back
                    ((deque<stackElem,_std::allocator<stackElem>_> *)&local_438,&local_508);
          std::vector<stackElem,_std::allocator<stackElem>_>::push_back
                    ((vector<stackElem,_std::allocator<stackElem>_> *)&local_4a8,&local_508);
        }
      }
    } while (iVar4 != 0);
    std::operator+(&local_478,&local_4f8,"SMOVE:");
    std::__cxx11::string::operator=((string *)&local_4f8,(string *)&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    lVar6 = (long)local_508.states;
    pvVar1 = (this->action_table).
             super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string
              ((string *)&local_328,
               (string *)
               ((long)&((local_4d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + local_500))
    ;
    iVar4 = find_name(this,&local_328);
    iVar4 = *(int *)(*(long *)&pvVar1[lVar6].
                               super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                               ._M_impl.super__Vector_impl_data + 4 + (long)iVar4 * 0xc);
    std::__cxx11::string::~string((string *)&local_328);
    std::ios::clear((int)*(undefined8 *)(local_1b8[0] + -0x18) + iVar3);
    std::ostream::operator<<(local_1a8,iVar4);
    std::operator>>((basic_istream<char,_std::char_traits<char>_> *)local_1b8,local_288);
    std::operator+(&local_3a8,&local_4f8,local_288);
    std::operator+(&local_478,&local_3a8,"\n");
    std::__cxx11::string::operator=((string *)&local_4f8,(string *)&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::string
              ((string *)&local_348,
               (string *)
               ((long)&((local_4d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + local_500))
    ;
    iVar3 = find_name(this,&local_348);
    local_508.elemKey = iVar3;
    std::__cxx11::string::~string((string *)&local_348);
    local_508.states = iVar4;
    std::deque<stackElem,_std::allocator<stackElem>_>::push_back
              ((deque<stackElem,_std::allocator<stackElem>_> *)&local_438,&local_508);
    std::vector<stackElem,_std::allocator<stackElem>_>::push_back
              ((vector<stackElem,_std::allocator<stackElem>_> *)&local_4a8,&local_508);
    uVar5 = (int)local_488 + 1;
    local_490 = local_490 + 0x20;
  } while( true );
}

Assistant:

bool  GrammarLR::sim(char* testString){

    bool result = true;
    //不使用testString，出现双字符串无法解释;
    vector<string> ipString;
    public_tool::parse_elem(testString, ipString);

    stack<stackElem> s;//指导栈
    vector<stackElem> elemprint;//输出作用
    char formatS[] = "%-25s";//栈的格式
    char formatC[] = "%+15s         ";//字母格式的格式
    string bufS;
    char buffer[200];		//格式化的辅助
    stringstream sstream;
    string tmp;				//字符串中间
    string text;			//输出的串
    int ipIndex = 0;//ip的指向

    stackElem e;
    e.elemKey = find_name("#");//#是开始字符
    e.states = 0;//0是初态
    s.push(e);
    elemprint.push_back(e);
    ReduceByExpress r;
    int st;
    while (action_table[e.states][find_name(ipString[ipIndex])].type == REDUCE || action_table[e.states][find_name(
            ipString[ipIndex])].type == SMOVE){
        e = s.top();

        //1.输出栈
        tmp = "";
        for (int i = 0; i < elemprint.size(); i++){
            tmp = tmp + elements[elemprint[i].elemKey].name;
            sstream.clear();
            sstream << elemprint[i].states;
            sstream >> buffer;
            tmp = tmp + buffer;
        }
        sprintf(buffer, formatS, tmp.c_str());
        text = text + buffer;
        //2.当前输入
        tmp = "";
        for (int i = ipIndex; i < ipString.size(); i++){
            tmp = tmp + ipString[i];
        }
        sprintf(buffer, formatC, tmp.c_str());
        text = text + buffer;

        switch (action_table[e.states][find_name(ipString[ipIndex])].type)
        {
            //不会出现
            case ERROR: break;

            case REDUCE:
                //归约操作
                //3.进行的动作
                text = text + "REDUCE:";
                //get表达式
                r = action_table[e.states][find_name(ipString[ipIndex])].choose.R;
                text = text + elements[r.elemIndex].name + "->";
                for (int i = 0; i < elements[r.elemIndex].expression_of_set[r.expressIndex].expression.size(); i++){
                    if (elements[r.elemIndex].expression_of_set[r.expressIndex][i] == -1){ continue; }
                    text = text + elements[elements[r.elemIndex].expression_of_set[r.expressIndex][i]].name;
                }
                text = text + "\n";

                //出栈
                for (int i = 0; i < elements[r.elemIndex].expression_of_set[r.expressIndex].expression.size(); i++){
                    s.pop();
                    elemprint.pop_back();
                }
                //替换终结符操作
                e = s.top();
                if (action_table[e.states][r.elemIndex].type == ERROR){
                    text = text + "ERROR";
                    break;//跳出swtich
                }
                e.elemKey = r.elemIndex;
                e.states = action_table[e.states][r.elemIndex].choose.state;
                s.push(e);
                elemprint.push_back(e);
                break;
            case SMOVE:
                //3.进行的动作
                text = text + "SMOVE:";
                //get表达式
                st = action_table[e.states][find_name(ipString[ipIndex])].choose.state;
                sstream.clear();
                sstream << st;
                sstream >> buffer;
                text = text + buffer + "\n";

                //入栈就行
                e.elemKey = find_name(ipString[ipIndex]);
                e.states = st;
                s.push(e);
                elemprint.push_back(e);
                ipIndex++;
                break;
                //不会出现
            case ACC: break;
            default:
                break;
        }
    }


    if (action_table[e.states][find_name(ipString[ipIndex])].type == ERROR) {
        result = false;
        text = text + "ERROR\n";
    }
    else
    {
        text = text + "ACC\n";
    }
    cout << text;
    return result;
}